

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_uint_vector.h
# Opt level: O0

void s2coding::EncodeUintWithLength<unsigned_long_long>
               (unsigned_long_long value,int length,Encoder *encoder)

{
  size_t sVar1;
  ostream *poVar2;
  bool local_7a;
  S2LogMessage local_78;
  S2LogMessageVoidify local_62;
  byte local_61;
  S2LogMessage local_60;
  S2LogMessageVoidify local_4d [20];
  byte local_39;
  S2LogMessage local_38;
  S2LogMessageVoidify local_21;
  Encoder *local_20;
  Encoder *encoder_local;
  unsigned_long_long uStack_10;
  int length_local;
  unsigned_long_long value_local;
  
  local_39 = 0;
  local_7a = 8 < (uint)length;
  local_20 = encoder;
  encoder_local._4_4_ = length;
  uStack_10 = value;
  if (local_7a) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_uint_vector.h"
               ,0x85,kFatal,(ostream *)&std::cerr);
    local_39 = 1;
    poVar2 = S2LogMessage::stream(&local_38);
    poVar2 = std::operator<<(poVar2,"Check failed: length >= 0 && length <= sizeof(T) ");
    S2LogMessageVoidify::operator&(&local_21,poVar2);
  }
  if ((local_39 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_38);
  }
  sVar1 = Encoder::avail(local_20);
  local_61 = 0;
  if (sVar1 < (ulong)(long)encoder_local._4_4_) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_60,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_uint_vector.h"
               ,0x86,kFatal,(ostream *)&std::cerr);
    local_61 = 1;
    poVar2 = S2LogMessage::stream(&local_60);
    poVar2 = std::operator<<(poVar2,"Check failed: (encoder->avail()) >= (length) ");
    S2LogMessageVoidify::operator&(local_4d,poVar2);
  }
  if ((local_61 & 1) == 0) {
    while (encoder_local._4_4_ = encoder_local._4_4_ + -1, -1 < encoder_local._4_4_) {
      Encoder::put8(local_20,(uchar)uStack_10);
      uStack_10 = uStack_10 >> 8;
    }
    if (uStack_10 == 0) {
      return;
    }
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_78,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_uint_vector.h"
               ,0x8c,kFatal,(ostream *)&std::cerr);
    poVar2 = S2LogMessage::stream(&local_78);
    poVar2 = std::operator<<(poVar2,"Check failed: (value) == (0) ");
    S2LogMessageVoidify::operator&(&local_62,poVar2);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_78);
  }
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_60);
}

Assistant:

inline void EncodeUintWithLength(T value, int length, Encoder* encoder) {
  static_assert(std::is_unsigned<T>::value, "Unsupported signed integer");
  static_assert(sizeof(T) & 0xe, "Unsupported integer length");
  S2_DCHECK(length >= 0 && length <= sizeof(T));
  S2_DCHECK_GE(encoder->avail(), length);

  while (--length >= 0) {
    encoder->put8(value);
    value >>= 8;
  }
  S2_DCHECK_EQ(value, 0);
}